

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSAX2InternalSubset(void)

{
  int iVar1;
  int iVar2;
  void *val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  int local_4c;
  int n_SystemID;
  xmlChar *SystemID;
  int n_ExternalID;
  xmlChar *ExternalID;
  int n_name;
  xmlChar *name;
  int n_ctx;
  void *ctx;
  int mem_base;
  int test_ret;
  
  ctx._4_4_ = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 2; name._4_4_ = name._4_4_ + 1) {
    for (ExternalID._4_4_ = 0; (int)ExternalID._4_4_ < 5; ExternalID._4_4_ = ExternalID._4_4_ + 1) {
      for (SystemID._4_4_ = 0; (int)SystemID._4_4_ < 5; SystemID._4_4_ = SystemID._4_4_ + 1) {
        for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_void_ptr(name._4_4_,0);
          val_00 = gen_const_xmlChar_ptr(ExternalID._4_4_,1);
          val_01 = gen_const_xmlChar_ptr(SystemID._4_4_,2);
          val_02 = gen_const_xmlChar_ptr(local_4c,3);
          xmlSAX2InternalSubset(val,val_00,val_01,val_02);
          call_tests = call_tests + 1;
          des_void_ptr(name._4_4_,val,0);
          des_const_xmlChar_ptr(ExternalID._4_4_,val_00,1);
          des_const_xmlChar_ptr(SystemID._4_4_,val_01,2);
          des_const_xmlChar_ptr(local_4c,val_02,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2InternalSubset",(ulong)(uint)(iVar2 - iVar1));
            ctx._4_4_ = ctx._4_4_ + 1;
            printf(" %d",(ulong)name._4_4_);
            printf(" %d",(ulong)ExternalID._4_4_);
            printf(" %d",(ulong)SystemID._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ctx._4_4_;
}

Assistant:

static int
test_xmlSAX2InternalSubset(void) {
    int test_ret = 0;

    int mem_base;
    void * ctx; /* the user data (XML parser context) */
    int n_ctx;
    const xmlChar * name; /* the root element name */
    int n_name;
    const xmlChar * ExternalID; /* the external ID */
    int n_ExternalID;
    const xmlChar * SystemID; /* the SYSTEM ID (e.g. filename or URL) */
    int n_SystemID;

    for (n_ctx = 0;n_ctx < gen_nb_void_ptr;n_ctx++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_ExternalID = 0;n_ExternalID < gen_nb_const_xmlChar_ptr;n_ExternalID++) {
    for (n_SystemID = 0;n_SystemID < gen_nb_const_xmlChar_ptr;n_SystemID++) {
        mem_base = xmlMemBlocks();
        ctx = gen_void_ptr(n_ctx, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        ExternalID = gen_const_xmlChar_ptr(n_ExternalID, 2);
        SystemID = gen_const_xmlChar_ptr(n_SystemID, 3);

        xmlSAX2InternalSubset(ctx, name, ExternalID, SystemID);
        call_tests++;
        des_void_ptr(n_ctx, ctx, 0);
        des_const_xmlChar_ptr(n_name, name, 1);
        des_const_xmlChar_ptr(n_ExternalID, ExternalID, 2);
        des_const_xmlChar_ptr(n_SystemID, SystemID, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSAX2InternalSubset",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctx);
            printf(" %d", n_name);
            printf(" %d", n_ExternalID);
            printf(" %d", n_SystemID);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}